

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe2_LPGCachePolicy.cpp
# Opt level: O1

GMM_STATUS __thiscall GmmLib::GmmXe2_LPGCachePolicy::InitCachePolicy(GmmXe2_LPGCachePolicy *this)

{
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 *paVar1;
  MEMORY_OBJECT_CONTROL_STATE *pMVar2;
  GMM_CACHE_POLICY_ELEMENT *pGVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  GMM_PRIVATE_PAT *pGVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint PATIdx;
  bool bVar16;
  GMM_CACHE_POLICY_TBL_ELEMENT local_48;
  GMM_CACHE_POLICY_TBL_ELEMENT UsageEle;
  GMM_XE2_PRIVATE_PAT UsagePATElement;
  
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  if (pGVar3 == (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    return GMM_ERROR;
  }
  paVar1 = &pGVar3[1].field_1;
  *(byte *)paVar1 = *(byte *)paVar1 & 0xfe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[1].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[2].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[3].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[6].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[7].field_1.Value = pGVar3[7].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[7].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  uVar4 = *(ulong *)&((*(Context **)
                        ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                super_GmmCachePolicyCommon + 8))->WaTable).field_0x4;
  uVar9 = uVar4 >> 0x17 & 0x800000000;
  if ((uVar4 >> 0x39 & 1) != 0) {
    uVar9 = 0x800000000;
  }
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[8].field_1.Value = pGVar3[8].field_1.Value & 0xfffffff3ffffffff | uVar9;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[8].field_1.Value = pGVar3[8].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[8].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[9].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[10].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  uVar4 = *(ulong *)&((*(Context **)
                        ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                                super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                                super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                                super_GmmCachePolicyCommon + 8))->WaTable).field_0x4;
  uVar9 = uVar4 >> 0x17 & 0x800000000;
  if ((uVar4 >> 0x39 & 1) != 0) {
    uVar9 = 0x800000000;
  }
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xb].field_1.Value = pGVar3[0xb].field_1.Value & 0xfffffff3ffffffff | uVar9;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xb].field_1.Value = pGVar3[0xb].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xb].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x14].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xc].field_1.Value = pGVar3[0xc].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xd].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x12].field_1.Value = pGVar3[0x12].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x13].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x15].field_1.Value = pGVar3[0x15].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x16].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))->field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x17].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x18].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x19].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1a].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x41].field_1.Value = pGVar3[0x41].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x42].field_1.Value = pGVar3[0x42].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1b].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x1c].field_1.Value = pGVar3[0x1c].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x1e].field_1.Value = pGVar3[0x1e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x1f].field_1.Value = pGVar3[0x1f].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x22].field_1.Value = pGVar3[0x22].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x23].field_1.Value = pGVar3[0x23].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x24].field_1.Value = pGVar3[0x24].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x25].field_1.Value = pGVar3[0x25].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x26].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x27].field_1.Value = pGVar3[0x27].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x28].field_1.Value = pGVar3[0x28].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x28].field_1.Value = pGVar3[0x28].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x28].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x29].field_1.Value = pGVar3[0x29].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x2a].field_1.Value = pGVar3[0x2a].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x2b].field_1.Value = pGVar3[0x2b].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x2c].field_1.Value = pGVar3[0x2c].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x2e].field_1.Value = pGVar3[0x2e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2e].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x2f].field_1.Value = pGVar3[0x2f].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x30].field_1.Value = pGVar3[0x30].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x31].field_1.Value = pGVar3[0x31].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x31].field_1.Value = pGVar3[0x31].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x32].field_1.Value = pGVar3[0x32].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x33].field_1.Value = pGVar3[0x33].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x34].field_1.Value = pGVar3[0x34].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x34].field_1.Value = pGVar3[0x34].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x35].field_1.Value = pGVar3[0x35].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x36].field_1.Value = pGVar3[0x36].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x37].field_1.Value = pGVar3[0x37].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x38].field_1.Value = pGVar3[0x38].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x3d].field_1.Value = pGVar3[0x3d].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x3d].field_1.Value = pGVar3[0x3d].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x39].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3a].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3b].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x3e].field_1.Value = pGVar3[0x3e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x3e].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x41].field_1.Value = pGVar3[0x41].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x42].field_1.Value = pGVar3[0x42].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x43].field_1.Value = pGVar3[0x43].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x40].field_1.Value = pGVar3[0x40].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x40].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x44].field_1.Value = pGVar3[0x44].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x45].field_1.Value = pGVar3[0x45].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x45].field_1.Value = pGVar3[0x45].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x46].field_1.Value = pGVar3[0x46].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x46].field_1.Value = pGVar3[0x46].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x47].field_1.Value = pGVar3[0x47].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x4d].field_1.Value = pGVar3[0x4d].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x48].field_1.Value = pGVar3[0x48].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x49].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x4a].field_1.Value = pGVar3[0x4a].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4a].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x4b].field_1.Value = pGVar3[0x4b].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x4c].field_1.Value = pGVar3[0x4c].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4c].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x4e].field_1.Value = pGVar3[0x4e].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x4e].field_1.Value = pGVar3[0x4e].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x50].field_1.Value = pGVar3[0x50].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x51].field_1.Value = pGVar3[0x51].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x52].field_1.Value = pGVar3[0x52].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x52].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x53].field_1.Value = pGVar3[0x53].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x53].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x54].field_1.Value = pGVar3[0x54].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x54].field_1.Value = pGVar3[0x54].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x5d].field_1.Value = pGVar3[0x5d].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x5d].field_1.Value = pGVar3[0x5d].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x5d].field_1.Value = pGVar3[0x5d].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x55].field_1.Value = pGVar3[0x55].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x55].field_1.Value = pGVar3[0x55].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x55].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x56].field_1.Value = pGVar3[0x56].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x56].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5c].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5e].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x5f].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x60].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x61].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x62].field_1.Value = pGVar3[0x62].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x62].field_1.Value = pGVar3[0x62].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x62].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[99].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[100].field_1.Value = pGVar3[100].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[100].field_1.Value = pGVar3[100].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[100].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x6e].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x70].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x71].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xdc].field_1.Value = pGVar3[0xdc].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xdd].field_1.Value = pGVar3[0xdd].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xdd].field_1.Value = pGVar3[0xdd].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdd].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xde].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe0].field_1.Value = pGVar3[0xe0].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe1].field_1.Value = pGVar3[0xe1].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe2].field_1.Value = pGVar3[0xe2].field_1.Value & 0xffffffffe3ffffff | 0x14000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe2].field_1.Value = pGVar3[0xe2].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe2].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe3].field_1.Value = pGVar3[0xe3].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe4].field_1.Value = pGVar3[0xe4].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe5].field_1.Value = pGVar3[0xe5].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe6].field_1.Value = pGVar3[0xe6].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe7].field_1.Value = pGVar3[0xe7].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe7].field_1.Value = pGVar3[0xe7].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xe9].field_1.Value = pGVar3[0xe9].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xea].field_1.Value = pGVar3[0xea].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xeb].field_1.Value = pGVar3[0xeb].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xed].field_1.Value = pGVar3[0xed].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xed].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf0].field_1.Value = pGVar3[0xf0].field_1.Value & 0xffffffffe3ffffff | 0x4000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf0].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf1].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf2].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf4].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf5].field_1.Value = pGVar3[0xf5].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf5].field_1.Value =
       pGVar3[0xf5].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf5].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf6].field_1.Value = pGVar3[0xf6].field_1.Value & 0xffffffff3fffffff | 0x40000000;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf6].field_1.Value = pGVar3[0xf6].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf6].field_1.Value =
       pGVar3[0xf6].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf6].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf7].field_1.Value = pGVar3[0xf7].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf7].field_1.Value =
       pGVar3[0xf7].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf7].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf8].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf9].field_1.Value = pGVar3[0xf9].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xf9].field_1.Value =
       pGVar3[0xf9].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xf9].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfa].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xfb].field_1.Value = pGVar3[0xfb].field_1.Value & 0xfffffffcffffffff | 0x200000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xfc].field_1.Value = pGVar3[0xfc].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfc].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xfd].field_1.Value = pGVar3[0xfd].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xfd].field_1.Value =
       pGVar3[0xfd].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfd].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xfe].field_1.Value = pGVar3[0xfe].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xfe].field_1.Value =
       pGVar3[0xfe].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xfe].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xff].field_1.Value = pGVar3[0xff].field_1.Value & 0xffffffff3fffffff | 0x40000000;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xff].field_1.Value = pGVar3[0xff].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0xff].field_1.Value =
       pGVar3[0xff].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0xff].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x100].field_1.Value = pGVar3[0x100].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x100].field_1.Value =
       pGVar3[0x100].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x100].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x101].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x102].field_1.Value = pGVar3[0x102].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x102].field_1.Value =
       pGVar3[0x102].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x102].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x103].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x104].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x105].field_1.Value = pGVar3[0x105].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x105].field_1.Value =
       pGVar3[0x105].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x105].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x106].field_1.Value = pGVar3[0x106].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x106].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x107].field_1.Value = pGVar3[0x107].field_1.Value & 0xfffffff3ffffffff | 0x400000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x107].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x108].field_1.Value = pGVar3[0x108].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x108].field_1.Value =
       pGVar3[0x108].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x108].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x109].field_1.Value = pGVar3[0x109].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x109].field_1.Value =
       pGVar3[0x109].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x109].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10a].field_1.Value = pGVar3[0x10a].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10a].field_1.Value =
       pGVar3[0x10a].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10a].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10b].field_1.Value = pGVar3[0x10b].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10b].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10c].field_1.Value = pGVar3[0x10c].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10c].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10d].field_1.Value = pGVar3[0x10d].field_1.Value & 0xfffffffcffffffff | 0x100000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10d].field_1.Value =
       pGVar3[0x10d].field_1.Value & 0xfffcffffffffffff |
       ((ulong)((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) << 0xf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10d].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10e].field_1.Value = pGVar3[0x10e].field_1.Value & 0xfffffffcffffffff | 0x200000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x10f].field_1.Value = pGVar3[0x10f].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x10f].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x110].field_1.Value = pGVar3[0x110].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x110].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x111].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x112].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
            ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                    super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                    super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
  pGVar3[0x113].field_1.Value = pGVar3[0x113].field_1.Value & 0xfffcffffffffffff | 0x1000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x113].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value | 0x3000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x114].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x115].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x116].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x117].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x118].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x119].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11a].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(*(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[0x11b].field_1;
  paVar1->Value = paVar1->Value | 0x10000000000000;
  SetUpMOCSTable(this);
  SetupPAT(this);
  lVar10 = 0;
  do {
    UsageEle.L3 = (anon_union_2_3_6e525fdd_for_L3)0x0;
    UsageEle.HDCL1 = '\0';
    UsageEle._7_1_ = 0;
    local_48.LeCC = (anon_union_4_3_53f8f047_for_LeCC)0x0;
    local_48.L3 = (anon_union_2_3_6e525fdd_for_L3)0x0;
    local_48.HDCL1 = '\0';
    local_48._7_1_ = 0;
    GetL3L4(this,&local_48,(GMM_XE2_PRIVATE_PAT *)&UsageEle.L3,(uint32_t)lVar10);
    GmmXe_LPGCachePolicy::SetL1CachePolicy(&this->super_GmmXe_LPGCachePolicy,(uint32_t)lVar10);
    if (((((*(Context **)
             ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                     super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                     super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8))->SkuTable).field_0.
          field_0x1 & 1) == 0) && ((local_48.L3.UshortValue & 0x30) == 0x10)) {
      local_48 = (GMM_CACHE_POLICY_TBL_ELEMENT)((ulong)local_48 & 0xffffffcfffffffff);
    }
    uVar12 = 0;
    if (((uint)local_48._4_4_ >> 8 & 1) != 0) {
      uVar14 = (this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
               super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
               CurrentMaxMocsIndex;
      if (uVar14 == 0) {
        uVar12 = 0xffffffff;
      }
      else {
        uVar11 = 2;
        do {
          uVar12 = uVar11 - 1;
          if ((((*(Context **)
                  ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                          super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                          super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                          super_GmmCachePolicyCommon + 8))->CachePolicyTbl[uVar11 - 1].L3.
                UshortValue ^ local_48.L3.UshortValue) & 0xfc) == 0) break;
          bVar16 = uVar11 <= uVar14;
          uVar11 = uVar11 + 1;
          uVar12 = 0xffffffff;
        } while (bVar16);
      }
    }
    if (((((*(Context **)
             ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                     super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                     super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 8))->SkuTable).field_0.
          field_0x1 & 1) == 0) && ((UsageEle._4_4_ & 0x30) == 0x10)) {
      UsageEle._4_4_ = UsageEle._4_4_ & 0xffffffcf;
    }
    uVar5 = UsageEle._4_4_;
    if ((UsageEle._4_4_ & 0x3c) == 0x14) {
      PATIdx = 6;
      if (((ulong)((*(Context **)
                     ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                             super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
                             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                             super_GmmCachePolicyCommon + 8))->SkuTable).field_1 & 0x200000000) == 0
         ) {
        PATIdx = 0xd;
      }
    }
    else {
      uVar14 = 1;
      uVar11 = 0xffffffff;
      do {
        PATIdx = uVar14 - 1;
        pGVar7 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,PATIdx);
        uVar8 = uVar5 ^ (uint)pGVar7;
        if (((uVar8 & 0x3f) == 0) && (((ulong)pGVar7 & 0x200) == 0 && (uVar8 & 0xc0) == 0)) {
          bVar16 = true;
        }
        else {
          bVar16 = false;
          PATIdx = uVar11;
        }
      } while ((!bVar16) &&
              (bVar16 = uVar14 <= *(uint *)&(this->super_GmmXe_LPGCachePolicy).
                                            super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                            field_0x2c, uVar14 = uVar14 + 1, uVar11 = PATIdx, bVar16
              ));
    }
    uVar5 = UsageEle._4_4_;
    uVar14 = 1;
    uVar11 = 0xffffffff;
    do {
      pGVar7 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,uVar14 - 1);
      uVar6 = UsageEle._4_4_;
      uVar8 = uVar5 ^ (uint)pGVar7;
      if (((uVar8 & 0x3f) != 0) ||
         (bVar16 = true, uVar13 = uVar14 - 1, ((byte)((uint)pGVar7 >> 9) & (uVar8 & 0xc0) == 0) == 0
         )) {
        bVar16 = false;
        uVar13 = uVar11;
      }
    } while ((!bVar16) &&
            (bVar16 = uVar14 <= *(uint *)&(this->super_GmmXe_LPGCachePolicy).
                                          super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                          field_0x2c, uVar14 = uVar14 + 1, uVar11 = uVar13, bVar16))
    ;
    UsageEle.LeCC.DwordValue._2_1_ = uVar12 == 0xffffffff;
    UsageEle.LeCC.DwordValue._3_1_ = PATIdx == 0xffffffff;
    uVar14 = PATIdx;
    if ((UsageEle._4_4_ & 2) == 0) {
      uVar14 = 0xffffffff;
      uVar11 = 1;
      do {
        pGVar7 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,uVar11 - 1);
        uVar5 = UsageEle._4_4_;
        uVar8 = uVar6 ^ (uint)pGVar7;
        if ((uVar8 & 0x3c) == 0) {
          if (((uint)pGVar7 & 3) == 2 && (uVar8 & 0xc0) == 0) {
            uVar15 = uVar11 - 1;
            if (uVar14 != 0xffffffff || ((ulong)pGVar7 & 0x200) != 0) {
              uVar15 = uVar14;
            }
            bVar16 = uVar15 != 0xffffffff;
            uVar14 = uVar15;
          }
          else {
            bVar16 = false;
          }
        }
        else {
          bVar16 = false;
        }
      } while ((!bVar16) &&
              (bVar16 = uVar11 <= *(uint *)&(this->super_GmmXe_LPGCachePolicy).
                                            super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                            field_0x2c, uVar11 = uVar11 + 1, bVar16));
      if (uVar14 == 0xffffffff) {
        uVar14 = 0xffffffff;
        uVar11 = 1;
        do {
          pGVar7 = GmmGen8CachePolicy::GetPrivatePATEntry((GmmGen8CachePolicy *)this,uVar11 - 1);
          uVar8 = (uint)pGVar7;
          if (((~uVar8 & 0x3c) == 0) && (bVar16 = false, (uVar8 & 3) == 2)) {
            if (((uVar5 ^ uVar8) & 0xc0) == 0) {
              uVar15 = uVar11 - 1;
              if (uVar14 != 0xffffffff || ((ulong)pGVar7 & 0x200) != 0) {
                uVar15 = uVar14;
              }
              bVar16 = uVar15 != 0xffffffff;
              uVar14 = uVar15;
            }
          }
          else {
            bVar16 = false;
          }
        } while ((!bVar16) &&
                (bVar16 = uVar11 <= *(uint *)&(this->super_GmmXe_LPGCachePolicy).
                                              super_GmmGen12CachePolicy.super_GmmGen11CachePolicy.
                                              field_0x2c, uVar11 = uVar11 + 1, bVar16));
      }
    }
    (*(GMM_CACHE_POLICY_ELEMENT **)
      ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy
              .super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
              super_GmmCachePolicyCommon + 0x18))[lVar10].field_3.PATIndex = PATIdx;
    pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar3[lVar10].field_1.Value =
         pGVar3[lVar10].field_1.Value & 0xfffffe0fffffffff | (ulong)(uVar14 & 0x1f) << 0x24;
    pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar3[lVar10].field_1.Value =
         pGVar3[lVar10].field_1.Value & 0xfffffdffffffffff | (ulong)(uVar14 >> 5 & 1) << 0x29;
    pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar3[lVar10].field_1.Value =
         pGVar3[lVar10].field_1.Value & 0xffff03ffffffffff | (ulong)(uVar13 & 0x3f) << 0x2a;
    (*(GMM_CACHE_POLICY_ELEMENT **)
      ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy
              .super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
              super_GmmCachePolicyCommon + 0x18))[lVar10].PTE.field_4.DwordValue =
         (PATIdx & 4) * 0x20 + (PATIdx & 3) * 8;
    (*(GMM_CACHE_POLICY_ELEMENT **)
      ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy
              .super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
              super_GmmCachePolicyCommon + 0x18))[lVar10].PTE.field_4.HighDwordValue =
         (uint)(((ulong)(PATIdx & 8) << 0x3b) >> 0x20) |
         (uint)(((ulong)(PATIdx & 0x10) << 0x39) >> 0x20);
    pGVar3 = *(GMM_CACHE_POLICY_ELEMENT **)
              ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                      super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.
                      super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18);
    pGVar3[lVar10].MemoryObjectOverride.DwordValue =
         (pGVar3[lVar10].MemoryObjectOverride.DwordValue & 0xffffff81) + (uVar12 & 0x3f) * 2;
    pMVar2 = &(*(GMM_CACHE_POLICY_ELEMENT **)
                ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.
                        super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.super_GmmGen9CachePolicy
                        .super_GmmGen8CachePolicy.super_GmmCachePolicyCommon + 0x18))[lVar10].
              MemoryObjectOverride;
    pMVar2->DwordValue = pMVar2->DwordValue & 0xfffffffe;
    (*(GMM_CACHE_POLICY_ELEMENT **)
      ((long)&(this->super_GmmXe_LPGCachePolicy).super_GmmGen12CachePolicy.super_GmmGen11CachePolicy
              .super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
              super_GmmCachePolicyCommon + 0x18))[lVar10].Override = 0xffffffff;
    if (UsageEle.LeCC.DwordValue._3_1_ != '\0' || UsageEle.LeCC.DwordValue._2_1_ != '\0') {
      return GMM_INVALIDPARAM;
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 0x11e) {
      return GMM_SUCCESS;
    }
  } while( true );
}

Assistant:

GMM_STATUS GmmLib::GmmXe2_LPGCachePolicy::InitCachePolicy()
{
    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, l3_cc, l3_clos, l1cc, l2cc, l4cc, coherency, igPAT, segov) DEFINE_CP_ELEMENT(usage, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, segov, 0, 0, l1cc, l2cc, l4cc, coherency, l3_cc, l3_clos, igPAT)

#include "GmmXe2_LPGCachePolicy.h"

    SetUpMOCSTable();
    SetupPAT();

    // Define index of cache element
    uint32_t Usage          = 0;
    uint32_t ReservedPATIdx = 13; /* Rsvd PAT section 13-19 */

#if (_WIN32 && (_DEBUG || _RELEASE_INTERNAL))
    void *pKmdGmmContext = NULL;
#if (defined(__GMM_KMD__))
    pKmdGmmContext = pGmmLibContext->GetGmmKmdContext();
#endif
    OverrideCachePolicy(pKmdGmmContext);
#endif
    // Process the cache policy and fill in the look up table
    for (; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        bool                         CachePolicyError = false;
        int32_t                      PATIdx = -1, CPTblIdx = -1, PATIdxCompressed = -1, CoherentPATIdx = -1;
        uint32_t                     i, j;
        GMM_XE2_PRIVATE_PAT          UsagePATElement = {0};
        GMM_CACHE_POLICY_TBL_ELEMENT UsageEle        = {0};
        GMM_PTE_CACHE_CONTROL_BITS   PTE             = {0};

        // MOCS data
        {

            // Get L3 ,L4 and Convert  GMM indicative values to actual regiser values.
            GetL3L4(&UsageEle, &UsagePATElement, Usage);
            // Convert L1  GMM indicative values to actual regiser values and store into pCachePolicy to return to UMD's.
            SetL1CachePolicy(Usage);

            if ((!pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush) && (UsageEle.L3.PhysicalL3.L3CC == GMM_GFX_PHY_L3_MT_WB_XD))
            {
                UsageEle.L3.PhysicalL3.L3CC = GMM_GFX_PHY_L3_MT_WB; // No Transient Flush Support
            }

            /* If MOCS is not needed fall back to Defer to PAT i.e MOCS#0 */
            if (false == UsageEle.L3.PhysicalL3.igPAT)
            {
                /* Set cache policy index to defered to PAT i.e. MOCS Index 0 */
                CPTblIdx = 0;
            }
            else
            {
                /* MOCS Index 1-3 are valid */
                for (j = 1; j <= CurrentMaxMocsIndex; j++)
                {
                    GMM_CACHE_POLICY_TBL_ELEMENT *TblEle = &pGmmLibContext->GetCachePolicyTlbElement()[j];
                    if (UsageEle.L3.PhysicalL3.L4CC == TblEle->L3.PhysicalL3.L4CC &&
                        UsageEle.L3.PhysicalL3.L3CC == TblEle->L3.PhysicalL3.L3CC &&
                        UsageEle.L3.PhysicalL3.L3CLOS == TblEle->L3.PhysicalL3.L3CLOS &&
                        UsageEle.L3.PhysicalL3.igPAT == true)
                    {
                        CPTblIdx = j;
                        break;
                    }
                }
            }

            if (CPTblIdx == -1)
            {

                {
                    /* Invalid MOCS setting Fail the GMM Initialzation */
                    GMM_ASSERTDPF(false, "CRITICAL: Cache Policy Usage value for L3/L4 specified by Client is not defined in Fixed MOCS Table");
                    CachePolicyError = true;

                }
            }
        }

        /*
            Validate Caching restrictions as below
            1. MemoryType WB-XD must be used in Non-Coherent and allowed only for displayable surfaces
            2. Coherent mode(1-way/2-way) must be Memory Type WB
            3. No 2-way coherency on dGPU
            4. Memory Type WT is available only for L4 in Non Coherent Mode
            5. Memory Type UC must be used in Non-Coherent Mode
        */

        // PAT data
        {
            if (!pGmmLibContext->GetSkuTable().FtrL3TransientDataFlush && (UsagePATElement.Xe2.L3CC == GMM_GFX_PHY_L3_MT_WB_XD))
            {
                UsagePATElement.Xe2.L3CC = GMM_GFX_PHY_L3_MT_WB; // No Transient Flush Support
            }

            /* Find a PATIndex from the PAT table for uncompressed case*/
            if ((UsagePATElement.Xe2.L4CC == GMM_GFX_PHY_L4_MT_WT) && (UsagePATElement.Xe2.L3CC == GMM_GFX_PHY_L3_MT_WB_XD))
            {

                // With L3:XD, L4:WT, NC combination
                if (pGmmLibContext->GetSkuTable().FtrDiscrete)
                {
                    // On BMG, L4 is a pass through, demote L4 to UC, keep L3 at XD
                    PATIdx = PAT6;
                }
                else
                {
                    // On LNL, L3:XD is not needed
                    PATIdx = PAT13;
                }
            }
            else
            {
                for (i = 0; i <= CurrentMaxPATIndex; i++)
                {
                    GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                    if (UsagePATElement.Xe2.L4CC == PAT.Xe2.L4CC &&
                        UsagePATElement.Xe2.Coherency == PAT.Xe2.Coherency &&
                        UsagePATElement.Xe2.L3CC == PAT.Xe2.L3CC &&
                        UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                        false == PAT.Xe2.LosslessCompressionEn)
                    {
                        PATIdx = i;
                        break;
                    }
                }
            }

            /* Find a PATIndex from the PAT table for compressed case*/
            for (i = 0; i <= CurrentMaxPATIndex; i++)
            {
                GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                if (UsagePATElement.Xe2.L4CC == PAT.Xe2.L4CC &&
                    UsagePATElement.Xe2.Coherency == PAT.Xe2.Coherency &&
                    UsagePATElement.Xe2.L3CC == PAT.Xe2.L3CC &&
                    UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                    true == PAT.Xe2.LosslessCompressionEn)
                {
                    PATIdxCompressed = i;
                    break;
                }
            }

            if (PATIdx == -1)
            {
// Didn't find the caching settings in one of the already programmed PAT table entries.
// Need to add a new lookup table entry.
                    GMM_ASSERTDPF(
                    "Cache Policy Init Error: Invalid Cache Programming, too many unique caching combinations"
                    "(we only support NumPATRegisters = %d)",
                    CurrentMaxPATIndex);
                    CachePolicyError = true;

                    PATIdx = GMM_PAT_ERROR;
            }

            /* Find a PATIndex for a coherent uncompressed case, if usage is 2-way or 1-way already, take that, otherwise search for oneway*/
            if ((UsagePATElement.Xe2.Coherency == GMM_GFX_PHY_COHERENT_ONE_WAY_IA_SNOOP) ||
                (UsagePATElement.Xe2.Coherency == GMM_GFX_PHY_COHERENT_TWO_WAY_IA_GPU_SNOOP))
            {
                //Already coherent
                CoherentPATIdx = PATIdx;
            }
            else
            {
                // search for equivalent one way coherent index
                for (i = 0; i <= CurrentMaxPATIndex; i++)
                {
                    GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                    if (UsagePATElement.Xe2.L4CC == PAT.Xe2.L4CC &&
                        UsagePATElement.Xe2.L3CC == PAT.Xe2.L3CC &&
                        UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                        GMM_GFX_PHY_COHERENT_ONE_WAY_IA_SNOOP == PAT.Xe2.Coherency)
                    {
                        if ((false == PAT.Xe2.LosslessCompressionEn) && (CoherentPATIdx == -1))
                        {
                            CoherentPATIdx = i;
                        }
                        if (CoherentPATIdx != -1)
                        {
                            break;
                        }
                    }
                }
                if (CoherentPATIdx == -1)
                {
                    //redo matching based on L3:UC, L4:UC, we should find one
                    for (i = 0; i <= CurrentMaxPATIndex; i++)
                    {
                        GMM_PRIVATE_PAT PAT = GetPrivatePATEntry(i);
                        if (GMM_GFX_PHY_L4_MT_UC == PAT.Xe2.L4CC &&
                            GMM_GFX_PHY_L3_MT_UC == PAT.Xe2.L3CC &&
                            UsagePATElement.Xe2.L3CLOS == PAT.Xe2.L3CLOS &&
                            GMM_GFX_PHY_COHERENT_ONE_WAY_IA_SNOOP == PAT.Xe2.Coherency)
                        {
                            if ((false == PAT.Xe2.LosslessCompressionEn) && (CoherentPATIdx == -1))
                            {
                                CoherentPATIdx = i;
                            }

                            if (CoherentPATIdx != -1)
                            {
                                break;
                            }
                        }
                    }
                }
            }
        }

        pCachePolicy[Usage].PATIndex                                 = PATIdx;
        pCachePolicy[Usage].CoherentPATIndex                         = GET_COHERENT_PATINDEX_LOWER_BITS(CoherentPATIdx); // Coherent uncompressed lower bits
        pCachePolicy[Usage].CoherentPATIndexHigherBit                = GET_COHERENT_PATINDEX_HIGHER_BIT(CoherentPATIdx); // Coherent uncompressed higher bits
        pCachePolicy[Usage].PATIndexCompressed                       = PATIdxCompressed;
        pCachePolicy[Usage].PTE.DwordValue                           = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) & 0xFFFFFFFF;
        pCachePolicy[Usage].PTE.HighDwordValue                       = GMM_GET_PTE_BITS_FROM_PAT_IDX(PATIdx) >> 32;
        pCachePolicy[Usage].MemoryObjectOverride.XE_HP.Index         = CPTblIdx;
        pCachePolicy[Usage].MemoryObjectOverride.XE_HP.EncryptedData = 0;
        pCachePolicy[Usage].Override                                 = ALWAYS_OVERRIDE;


        if (CachePolicyError)
        {
            GMM_ASSERTDPF(false, "Cache Policy Init Error: Invalid Cache Programming ");

            return GMM_INVALIDPARAM;
        }
    }
    return GMM_SUCCESS;
}